

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

void anon_unknown.dwarf_39db::indirect(ostream *stream,Indirect *type)

{
  ostream *poVar1;
  string local_a8 [32];
  anon_unknown_dwarf_39db local_88 [48];
  string local_58 [32];
  anon_unknown_dwarf_39db local_38 [32];
  Indirect *local_18;
  Indirect *type_local;
  ostream *stream_local;
  
  local_18 = type;
  type_local = (Indirect *)stream;
  poVar1 = std::operator<<(stream," name=\"");
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(local_38,local_58);
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  poVar1 = std::operator<<(poVar1,"\" of=\"");
  Typelib::Indirect::getIndirection();
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(local_88,local_a8);
  poVar1 = std::operator<<(poVar1,(string *)local_88);
  std::operator<<(poVar1,"\"");
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void indirect(ostream& stream, Indirect const& type)
    {
        stream
            << " name=\"" << xmlEscape(type.getName())
            << "\" of=\"" << xmlEscape(type.getIndirection().getName()) << "\"";
    }